

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_atomics_notify(JSContext *ctx,JSValue this_obj,int argc,JSValue *argv)

{
  list_head *plVar1;
  list_head *plVar2;
  int32_t iVar3;
  int iVar4;
  list_head *plVar5;
  list_head *plVar6;
  JSValueUnion JVar7;
  list_head **pplVar8;
  int64_t iVar9;
  JSValue JVar10;
  JSValue val;
  int32_t count;
  JSArrayBuffer *abuf;
  list_head waiter_list;
  
  JVar7.float64 = 0.0;
  plVar5 = (list_head *)js_atomics_get_ptr(ctx,&abuf,(int *)0x0,(JSClassID *)0x0,*argv,argv[1],1);
  iVar9 = 6;
  if (plVar5 != (list_head *)0x0) {
    if ((int)argv[2].tag == 3) {
      count = 0x7fffffff;
    }
    else {
      JVar7.float64 = 0.0;
      val.tag = argv[2].tag;
      val.u.ptr = argv[2].u.ptr;
      iVar4 = JS_ToInt32Clamp(ctx,&count,val,0,0x7fffffff,0);
      if (iVar4 != 0) goto LAB_0015a93a;
    }
    iVar3 = count;
    if (abuf->detached == '\0') {
      JVar7.float64 = 0.0;
      if (0 < count && abuf->shared != '\0') {
        pthread_mutex_lock((pthread_mutex_t *)&js_atomics_mutex);
        pplVar8 = &waiter_list.next;
        waiter_list.next = &waiter_list;
        plVar1 = js_atomics_waiter_list.next;
        waiter_list.prev = &waiter_list;
        do {
          do {
            plVar6 = plVar1;
            if (plVar6 == &js_atomics_waiter_list) goto LAB_0015a920;
            plVar1 = plVar6->next;
          } while (plVar6[4].next != plVar5);
          plVar2 = plVar6->prev;
          plVar2->next = plVar1;
          plVar1->prev = plVar2;
          *(undefined4 *)&plVar6[1].prev = 0;
          plVar6->prev = (list_head *)0x0;
          plVar6->next = (list_head *)0x0;
          (waiter_list.prev)->next = plVar6;
          plVar6->prev = waiter_list.prev;
          plVar6->next = &waiter_list;
          JVar7._0_4_ = JVar7.int32 + 1;
          JVar7._4_4_ = 0;
          waiter_list.prev = plVar6;
        } while ((int)JVar7._0_4_ < iVar3);
LAB_0015a920:
        while (plVar5 = *pplVar8, plVar5 != &waiter_list) {
          pthread_cond_signal((pthread_cond_t *)&plVar5[1].next);
          pplVar8 = &plVar5->next;
        }
        pthread_mutex_unlock((pthread_mutex_t *)&js_atomics_mutex);
      }
      iVar9 = 0;
    }
    else {
      JS_ThrowTypeErrorDetachedArrayBuffer(ctx);
      JVar7.float64 = 0.0;
    }
  }
LAB_0015a93a:
  JVar10.tag = iVar9;
  JVar10.u.float64 = JVar7.float64;
  return JVar10;
}

Assistant:

static JSValue js_atomics_notify(JSContext *ctx,
                                 JSValueConst this_obj,
                                 int argc, JSValueConst *argv)
{
    struct list_head *el, *el1, waiter_list;
    int32_t count, n;
    void *ptr;
    JSAtomicsWaiter *waiter;
    JSArrayBuffer *abuf;

    ptr = js_atomics_get_ptr(ctx, &abuf, NULL, NULL, argv[0], argv[1], 1);
    if (!ptr)
        return JS_EXCEPTION;

    if (JS_IsUndefined(argv[2])) {
        count = INT32_MAX;
    } else {
        if (JS_ToInt32Clamp(ctx, &count, argv[2], 0, INT32_MAX, 0))
            return JS_EXCEPTION;
    }
    if (abuf->detached)
        return JS_ThrowTypeErrorDetachedArrayBuffer(ctx);

    n = 0;
    if (abuf->shared && count > 0) {
        pthread_mutex_lock(&js_atomics_mutex);
        init_list_head(&waiter_list);
        list_for_each_safe(el, el1, &js_atomics_waiter_list) {
            waiter = list_entry(el, JSAtomicsWaiter, link);
            if (waiter->ptr == ptr) {
                list_del(&waiter->link);
                waiter->linked = FALSE;
                list_add_tail(&waiter->link, &waiter_list);
                n++;
                if (n >= count)
                    break;
            }
        }
        list_for_each(el, &waiter_list) {
            waiter = list_entry(el, JSAtomicsWaiter, link);
            pthread_cond_signal(&waiter->cond);
        }
        pthread_mutex_unlock(&js_atomics_mutex);
    }
    return JS_NewInt32(ctx, n);
}